

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O0

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::update
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,uchar outchar,uchar inchar)

{
  uint local_18;
  byte local_12;
  uchar local_11;
  uint z;
  uchar inchar_local;
  uchar outchar_local;
  GeneralHash<0,_unsigned_int,_unsigned_char> *this_local;
  
  this->hashvalue = this->hashvalue << 1;
  if ((this->hashvalue & this->lastbit) == this->lastbit) {
    this->hashvalue = this->irreduciblepoly ^ this->hashvalue;
  }
  local_18 = (this->hasher).hashvalues[outchar];
  local_12 = inchar;
  local_11 = outchar;
  _z = this;
  fastleftshift(this,&local_18,this->n);
  this->hashvalue = local_18 ^ (this->hasher).hashvalues[local_12] ^ this->hashvalue;
  return;
}

Assistant:

void update(chartype outchar, chartype inchar) {
    hashvalue <<= 1;
    if ((hashvalue & lastbit) == lastbit)
      hashvalue ^= irreduciblepoly;
    //
    hashvaluetype z(hasher.hashvalues[outchar]);
    // the compiler should optimize away the next if/else
    if (precomputationtype == FULLPRECOMP) {
      fastleftshiftn(z);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    } else {
      fastleftshift(z, n);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    }
  }